

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::LaxPolygonLayer::BuildDirected(LaxPolygonLayer *this,Graph *g,S2Error *error)

{
  pointer *this_00;
  bool bVar1;
  DegenerateBoundaries DVar2;
  EdgeId EVar3;
  size_type sVar4;
  reference pvVar5;
  reference pPVar6;
  GraphOptions *options;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  IdSetLexicon *input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> *label_set_ids;
  IdSetLexicon *label_set_lexicon;
  IsFullPolygonPredicate *__x;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1d8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1b8;
  undefined1 local_1a0 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  edge_loops;
  Graph local_168;
  int *local_100;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  uint local_f0;
  PolygonDegeneracy local_ec;
  iterator iStack_e8;
  PolygonDegeneracy degeneracy;
  iterator __end3;
  iterator __begin3;
  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  *__range3;
  vector<int,_std::allocator<int>_> edges_to_discard;
  undefined1 local_98 [8];
  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  degeneracies;
  bool discard_holes;
  undefined1 local_68 [4];
  DegenerateBoundaries degenerate_boundaries;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  vector<int,_std::allocator<int>_> new_input_edge_id_set_ids;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> new_edges;
  S2Error *error_local;
  Graph *g_local;
  LaxPolygonLayer *this_local;
  
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &new_input_edge_id_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &loops.
              super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
            *)local_68);
  DVar2 = Options::degenerate_boundaries(&this->options_);
  if (DVar2 == DISCARD) {
    EVar3 = S2Builder::Graph::num_edges(g);
    if (EVar3 == 0) {
      MaybeAddFullLoop(g,(vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                          *)local_68,error);
    }
  }
  else if (DVar2 == KEEP) {
    bVar1 = IsFullyDegenerate(g);
    if (bVar1) {
      MaybeAddFullLoop(g,(vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                          *)local_68,error);
    }
  }
  else {
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = DVar2 == DISCARD_HOLES;
    FindPolygonDegeneracies
              ((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                *)local_98,g,error);
    bVar1 = S2Error::ok(error);
    if (bVar1) {
      sVar4 = std::
              vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ::size((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                      *)local_98);
      EVar3 = S2Builder::Graph::num_edges(g);
      if (sVar4 == (long)EVar3) {
        bVar1 = std::
                vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                ::empty((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                         *)local_98);
        if (bVar1) {
          MaybeAddFullLoop(g,(vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                              *)local_68,error);
        }
        else {
          pvVar5 = std::
                   vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                   ::operator[]((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                                 *)local_98,0);
          if ((int)*pvVar5 < 0) {
            edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00 = &edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
                      ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this_00);
            std::
            vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
            ::push_back((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                         *)local_68,(value_type *)this_00);
            std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
                      ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                       &edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range3)
      ;
      __end3 = std::
               vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
               ::begin((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                        *)local_98);
      iStack_e8 = std::
                  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ::end((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                         *)local_98);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff18), bVar1) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<s2builderutil::PolygonDegeneracy_*,_std::vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>_>
                 ::operator*(&__end3);
        local_ec = *pPVar6;
        if ((uint)local_ec >> 0x1f ==
            (uint)(degeneracies.
                   super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1)) {
          local_f0 = (uint)local_ec & 0x7fffffff;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range3,
                     (value_type_conflict1 *)&local_f0);
        }
        __gnu_cxx::
        __normal_iterator<s2builderutil::PolygonDegeneracy_*,_std::vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>_>
        ::operator++(&__end3);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)&__range3);
      if (!bVar1) {
        local_f8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&__range3);
        local_100 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)&__range3);
        std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_f8,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            local_100);
        DiscardEdges(g,(vector<int,_std::allocator<int>_> *)&__range3,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &new_input_edge_id_set_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<int,_std::allocator<int>_> *)
                     &loops.
                      super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        options = S2Builder::Graph::options(g);
        vertices = S2Builder::Graph::vertices(g);
        input_edge_id_set_lexicon = S2Builder::Graph::input_edge_id_set_lexicon(g);
        label_set_ids = S2Builder::Graph::label_set_ids(g);
        label_set_lexicon = S2Builder::Graph::label_set_lexicon(g);
        __x = S2Builder::Graph::is_full_polygon_predicate(g);
        std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::function
                  ((function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)
                   &edge_loops.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
        S2Builder::Graph::Graph
                  (&local_168,options,vertices,
                   (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &new_input_edge_id_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<int,_std::allocator<int>_> *)
                   &loops.
                    super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,input_edge_id_set_lexicon,
                   label_set_ids,label_set_lexicon,
                   (IsFullPolygonPredicate *)
                   &edge_loops.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        S2Builder::Graph::operator=(g,&local_168);
        S2Builder::Graph::~Graph(&local_168);
        std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::~function
                  ((function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)
                   &edge_loops.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range3);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    std::vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ::~vector((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
               *)local_98);
    if (bVar1) goto LAB_00436fed;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_1a0);
  bVar1 = S2Builder::Graph::GetDirectedLoops
                    (g,CIRCUIT,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_1a0,error);
  if (bVar1) {
    AppendPolygonLoops(this,g,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_1a0,
                       (vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                        *)local_68);
    AppendEdgeLabels(this,g,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_1a0);
    local_1b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_1b8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::swap(&local_1b8,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_1a0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_1b8);
    local_1d8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_1d8);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::swap
              (&local_1d8,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &new_input_edge_id_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_1d8);
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_1f8);
    std::vector<int,_std::allocator<int>_>::swap
              (&local_1f8,
               (vector<int,_std::allocator<int>_> *)
               &loops.
                super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::~vector(&local_1f8);
    S2LaxPolygonShape::Init
              (this->polygon_,
               (vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                *)local_68);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_1a0);
LAB_00436fed:
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
             *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &loops.
              super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &new_input_edge_id_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void LaxPolygonLayer::BuildDirected(Graph g, S2Error* error) {
  // Some cases are implemented by constructing a new graph with certain
  // degenerate edges removed (overwriting "g").  "new_edges" is where the
  // edges for the new graph are stored.
  vector<Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_id_set_ids;
  vector<vector<S2Point>> loops;
  auto degenerate_boundaries = options_.degenerate_boundaries();
  if (degenerate_boundaries == DegenerateBoundaries::DISCARD) {
    // This is the easiest case, since there are no degeneracies.
    if (g.num_edges() == 0) MaybeAddFullLoop(g, &loops, error);
  } else if (degenerate_boundaries == DegenerateBoundaries::KEEP) {
    // S2LaxPolygonShape doesn't need to distinguish degenerate shells from
    // holes except when the entire graph is degenerate, in which case we need
    // to decide whether it represents an empty polygons possibly with
    // degenerate shells, or a full polygon possibly with degenerate holes.
    if (s2builderutil::IsFullyDegenerate(g)) {
      MaybeAddFullLoop(g, &loops, error);
    }
  } else {
    // For DISCARD_SHELLS and DISCARD_HOLES we first determine whether any
    // degenerate loops of the given type exist, and if so we construct a new
    // graph with those edges removed (overwriting "g").
    bool discard_holes =
        (degenerate_boundaries == DegenerateBoundaries::DISCARD_HOLES);
    auto degeneracies = s2builderutil::FindPolygonDegeneracies(g, error);
    if (!error->ok()) return;
    if (degeneracies.size() == g.num_edges()) {
      if (degeneracies.empty()) {
        MaybeAddFullLoop(g, &loops, error);
      } else if (degeneracies[0].is_hole) {
        loops.push_back({});  // Full loop.
      }
    }
    vector<EdgeId> edges_to_discard;
    for (auto degeneracy : degeneracies) {
      if (degeneracy.is_hole == discard_holes) {
        edges_to_discard.push_back(degeneracy.edge_id);
      }
    }
    if (!edges_to_discard.empty()) {
      // Construct a new graph that discards the unwanted edges.
      std::sort(edges_to_discard.begin(), edges_to_discard.end());
      DiscardEdges(g, edges_to_discard, &new_edges, &new_input_edge_id_set_ids);
      g = Graph(g.options(), &g.vertices(),
                &new_edges, &new_input_edge_id_set_ids,
                &g.input_edge_id_set_lexicon(), &g.label_set_ids(),
                &g.label_set_lexicon(), g.is_full_polygon_predicate());
    }
  }
  vector<Graph::EdgeLoop> edge_loops;
  if (!g.GetDirectedLoops(LoopType::CIRCUIT, &edge_loops, error)) {
    return;
  }
  AppendPolygonLoops(g, edge_loops, &loops);
  AppendEdgeLabels(g, edge_loops);
  vector<Graph::EdgeLoop>().swap(edge_loops);  // Release memory
  vector<Edge>().swap(new_edges);
  vector<InputEdgeIdSetId>().swap(new_input_edge_id_set_ids);
  polygon_->Init(loops);
}